

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristics.cpp
# Opt level: O2

void __thiscall Clasp::ClaspVmtf::setConfig(ClaspVmtf *this,HeuParams *params)

{
  TypeSet *t;
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = *(ushort *)params;
  uVar3 = 2;
  if (2 < uVar1) {
    uVar3 = (uint)uVar1;
  }
  uVar2 = 8;
  if (uVar1 != 0) {
    uVar2 = uVar3;
  }
  this->nMove_ = uVar2;
  this->scType_ =
       (*(ushort *)&params->field_0x2 & 3) + (uint)((*(ushort *)&params->field_0x2 & 3) == 0);
  this->nant_ = (bool)((byte)(*(uint *)params >> 0x15) & 1);
  (this->types_).m = 0;
  t = &this->types_;
  uVar3 = *(uint *)params >> 0x12 & 3;
  addOther(t,uVar3 + (uVar3 == 0));
  if ((params->field_0x2 & 0x10) != 0) {
    *(byte *)&t->m = (byte)t->m | 1;
  }
  if (this->scType_ == 1) {
    *(byte *)&t->m = (byte)t->m | 2;
  }
  return;
}

Assistant:

void ClaspVmtf::setConfig(const HeuParams& params) {
	nMove_  = params.param ? std::max(params.param, uint32(2)) : 8u;
	scType_ = params.score != HeuParams::score_auto ? params.score : static_cast<uint32>(HeuParams::score_min);
	nant_   = params.nant != 0;
	addOther(types_ = TypeSet(), params.other != HeuParams::other_auto ? params.other : static_cast<uint32>(HeuParams::other_no));
	if (params.moms) { types_.addSet(Constraint_t::Static); }
	if (scType_ == HeuParams::score_min) { types_.addSet(Constraint_t::Conflict); }
}